

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovQueue.cpp
# Opt level: O3

cl_command_queue
cov::createCommandQueue
          (cl_context context,cl_device_id device,cl_command_queue_properties properties,
          cl_int *errcodeRet)

{
  ObjectMagic *pOVar1;
  int iVar2;
  Queue *this;
  cl_int cVar3;
  
  if (*(cl_device_id *)(context + 0x10) == device) {
    this = (Queue *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    if (this == (Queue *)0x0) {
      cVar3 = -6;
    }
    else {
      Queue::Queue(this,(Context *)context,(Device *)device,properties != 1,properties == 2);
      *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>.m_icdTable = 1;
      cVar3 = 0;
      if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess != false)
      goto LAB_00103472;
      LOCK();
      pOVar1 = &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_magic;
      *(int *)pOVar1 = *(int *)pOVar1 + -1;
      UNLOCK();
      iVar2._0_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_magic;
      iVar2._1_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess;
      iVar2._2_2_ = *(undefined2 *)
                     &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).field_0xa;
      cVar3 = -5;
      if (iVar2 == 0) {
        operator_delete(this,0x10);
      }
    }
  }
  else {
    cVar3 = -0x21;
  }
  this = (Queue *)0x0;
LAB_00103472:
  *errcodeRet = cVar3;
  return (cl_command_queue)this;
}

Assistant:

cl_command_queue createCommandQueue(cl_context context,
                                    cl_device_id device,
                                    cl_command_queue_properties properties,
                                    cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);
    auto d = reinterpret_cast<Device*>(device);
    if (!c->hasDevice(d)) {
        *errcodeRet = CL_INVALID_DEVICE;
        return nullptr;
    }

    bool isOutOfOrder = properties != CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE;
    bool enableProfiling = properties == CL_QUEUE_PROFILING_ENABLE;
    auto queue = new(std::nothrow) Countable<Queue>(*c, *d, isOutOfOrder, enableProfiling);
    if (!queue) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto q = reinterpret_cast<Queue*>(queue);
    if (!q->initSuccess()) {
        q->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_command_queue*>(q);
}